

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int streqci(char *s1,char *s2)

{
  char local_22;
  char local_21;
  char c2;
  char *pcStack_20;
  char c1;
  char *s2_local;
  char *s1_local;
  
  pcStack_20 = s2;
  s2_local = s1;
  while( true ) {
    local_21 = *s2_local;
    local_22 = *pcStack_20;
    if (('`' < local_21) && (local_21 < '{')) {
      local_21 = local_21 + -0x20;
    }
    if (('`' < local_22) && (local_22 < '{')) {
      local_22 = local_22 + -0x20;
    }
    if (local_21 != local_22) break;
    pcStack_20 = pcStack_20 + 1;
    s2_local = s2_local + 1;
    if (local_21 == '\0') {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int FASTCALL
streqci(const char *s1, const char *s2)
{
  for (;;) {
    char c1 = *s1++;
    char c2 = *s2++;
    if (ASCII_a <= c1 && c1 <= ASCII_z)
      c1 += ASCII_A - ASCII_a;
    if (ASCII_a <= c2 && c2 <= ASCII_z)
      c2 += ASCII_A - ASCII_a;
    if (c1 != c2)
      return 0;
    if (!c1)
      break;
  }
  return 1;
}